

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O0

bool uWS::WebSocketContext<true,_true>::handleFragment
               (char *data,size_t length,uint remainingBytes,int opCode,bool fin,
               WebSocketState<true> *webSocketState,void *s)

{
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  string_view compressed;
  string_view compressed_00;
  string_view message;
  string_view message_00;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  char *__str;
  type *this;
  type_conflict *ptVar5;
  long lVar6;
  ulong uVar7;
  int in_ECX;
  int in_EDX;
  size_type in_RSI;
  uchar *in_RDI;
  byte in_R8B;
  WebSocket<true,_true> *in_stack_00000008;
  CloseFrame closeFrame_1;
  char *controlBuffer;
  CloseFrame closeFrame;
  WebSocket<true,_true> *webSocket;
  type_conflict *valid_1;
  type *inflatedFrame_1;
  LoopData *loopData_1;
  type_conflict *valid;
  type *inflatedFrame;
  LoopData *loopData;
  WebSocketData *webSocketData;
  WebSocketContextData<false> *webSocketContextData;
  WebSocket<true,_true> *in_stack_fffffffffffffe08;
  WebSocketState<true> *in_stack_fffffffffffffe10;
  OpCode OVar8;
  WebSocketState<true> *in_stack_fffffffffffffe18;
  WebSocket<true,_true> *pWVar9;
  operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>
  *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  char *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffea0;
  ZlibContext *in_stack_fffffffffffffea8;
  InflationStream *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec2;
  char *local_138;
  size_type local_130;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  undefined4 local_f8;
  int in_stack_ffffffffffffff0c;
  WebSocket<true,_true> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> local_c0 [2];
  undefined8 local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  type_conflict *local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70 [2];
  undefined8 local_48;
  long local_40;
  undefined8 local_38;
  byte local_21;
  int local_20;
  int local_1c;
  size_type local_18;
  uchar *local_10;
  
  local_21 = in_R8B & 1;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar3 = us_socket_context(1,in_stack_00000008);
  local_38 = us_socket_context_ext(1,uVar3);
  local_40 = us_socket_ext(1,in_stack_00000008);
  pWVar9 = in_stack_00000008;
  if (local_20 < 3) {
    if (((local_1c == 0) && ((local_21 & 1) != 0)) &&
       (lVar4 = std::__cxx11::string::length(), lVar4 == 0)) {
      if (*(char *)(local_40 + 0x5d) == '\x02') {
        *(undefined1 *)(local_40 + 0x5d) = 1;
        uVar3 = us_socket_context(1,in_stack_00000008);
        uVar3 = us_socket_context_loop(1,uVar3);
        local_48 = us_loop_ext(uVar3);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (local_70,(char *)local_10,local_18);
        compressed._M_str._0_2_ = in_stack_fffffffffffffec0;
        compressed._M_len = (size_t)in_stack_fffffffffffffeb8;
        compressed._M_str._2_6_ = in_stack_fffffffffffffec2;
        InflationStream::inflate
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,compressed,
                   in_stack_fffffffffffffea0);
        local_78 = std::get<0ul,std::basic_string_view<char,std::char_traits<char>>,bool>
                             ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *)
                              0x27281b);
        local_80 = std::get<1ul,std::basic_string_view<char,std::char_traits<char>>,bool>
                             ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *)
                              0x272830);
        if ((*local_80 & 1U) == 0) {
          forceClose(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          return true;
        }
        local_10 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::data(local_78);
        local_18 = std::basic_string_view<char,_std::char_traits<char>_>::length(local_78);
      }
      if ((local_20 == 1) && (bVar1 = protocol::isValidUtf8(local_10,local_18), !bVar1)) {
        forceClose(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        return true;
      }
      OVar8 = (OpCode)((ulong)in_stack_fffffffffffffe10 >> 0x38);
      bVar1 = fu2::abi_400::detail::function::operator_cast_to_bool
                        ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
                          *)0x2728e5);
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_90,(char *)local_10,local_18);
        args_1._M_len._4_4_ = in_stack_fffffffffffffe2c;
        args_1._M_len._0_4_ = in_stack_fffffffffffffe28;
        args_1._M_str = in_stack_fffffffffffffe30;
        fu2::abi_400::detail::type_erasure::invocation_table::
        operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>
        ::operator()(in_stack_fffffffffffffe20,(WebSocket<true,_true> *)in_stack_fffffffffffffe18,
                     args_1,OVar8);
        iVar2 = us_socket_is_closed(1,in_stack_00000008);
        if ((iVar2 != 0) || ((*(byte *)(local_40 + 0x5c) & 1) != 0)) {
          return true;
        }
      }
    }
    else {
      lVar4 = std::__cxx11::string::length();
      if (lVar4 == 0) {
        std::__cxx11::string::reserve(local_40 + 0x38);
      }
      std::__cxx11::string::length();
      bVar1 = refusePayloadLength((uint64_t)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                                  in_stack_fffffffffffffe10);
      if (bVar1) {
        forceClose(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        return true;
      }
      std::__cxx11::string::append((char *)(local_40 + 0x38),(ulong)local_10);
      if ((local_1c == 0) && ((local_21 & 1) != 0)) {
        if (*(char *)(local_40 + 0x5d) == '\x02') {
          *(undefined1 *)(local_40 + 0x5d) = 1;
          std::__cxx11::string::append((char *)(local_40 + 0x38));
          uVar3 = us_socket_context(1,in_stack_00000008);
          uVar3 = us_socket_context_loop(1,uVar3);
          local_98 = us_loop_ext(uVar3);
          __str = (char *)std::__cxx11::string::data();
          lVar4 = std::__cxx11::string::length();
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (local_c0,__str,lVar4 - 4);
          compressed_00._M_str._0_2_ = in_stack_fffffffffffffec0;
          compressed_00._M_len = (size_t)in_stack_fffffffffffffeb8;
          compressed_00._M_str._2_6_ = in_stack_fffffffffffffec2;
          InflationStream::inflate
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,compressed_00,
                     in_stack_fffffffffffffea0);
          this = std::get<0ul,std::basic_string_view<char,std::char_traits<char>>,bool>
                           ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *)
                            0x272b7b);
          ptVar5 = std::get<1ul,std::basic_string_view<char,std::char_traits<char>>,bool>
                             ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *)
                              0x272b90);
          if ((*ptVar5 & 1U) == 0) {
            forceClose(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
            return true;
          }
          local_10 = (uchar *)std::basic_string_view<char,_std::char_traits<char>_>::data(this);
          local_18 = std::basic_string_view<char,_std::char_traits<char>_>::length(this);
        }
        else {
          local_18 = std::__cxx11::string::length();
          local_10 = (uchar *)std::__cxx11::string::data();
        }
        if ((local_20 == 1) && (bVar1 = protocol::isValidUtf8(local_10,local_18), !bVar1)) {
          forceClose(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          return true;
        }
        OVar8 = (OpCode)((ulong)in_stack_fffffffffffffe10 >> 0x38);
        bVar1 = fu2::abi_400::detail::function::operator_cast_to_bool
                          ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>
                            *)0x272c77);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff20,
                     (char *)local_10,local_18);
          args_1_00._M_len._4_4_ = in_stack_fffffffffffffe2c;
          args_1_00._M_len._0_4_ = in_stack_fffffffffffffe28;
          args_1_00._M_str = in_stack_fffffffffffffe30;
          fu2::abi_400::detail::type_erasure::invocation_table::
          operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>_>,_void_(uWS::WebSocket<true,_true>_*,_std::basic_string_view<char,_std::char_traits<char>_>,_uWS::OpCode)>
          ::operator()(in_stack_fffffffffffffe20,(WebSocket<true,_true> *)in_stack_fffffffffffffe18,
                       args_1_00,OVar8);
          iVar2 = us_socket_is_closed(1,in_stack_00000008);
          if ((iVar2 != 0) || ((*(byte *)(local_40 + 0x5c) & 1) != 0)) {
            return true;
          }
        }
        std::__cxx11::string::clear();
      }
    }
  }
  else if (((local_1c == 0) && ((local_21 & 1) != 0)) && (*(int *)(local_40 + 0x58) == 0)) {
    if (local_20 == 8) {
      protocol::parseClosePayload
                (in_stack_fffffffffffffe50,
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_110,(char *)CONCAT44(in_stack_ffffffffffffff0c,local_f8),
                 (size_type)in_stack_ffffffffffffff10);
      message._M_str = in_stack_ffffffffffffff20;
      message._M_len = (size_t)in_stack_00000008;
      WebSocket<true,_true>::end(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,message);
      return true;
    }
    if (local_20 == 9) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_120,(char *)local_10,local_18);
      WebSocket<true,_true>::send(pWVar9,(int)local_120._M_len,local_120._M_str,10,0);
      bVar1 = fu2::abi_400::detail::function::operator_cast_to_bool
                        ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
                          *)0x272e5e);
      if (bVar1) {
        fu2::abi_400::detail::type_erasure::invocation_table::
        operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>,_void_(uWS::WebSocket<true,_true>_*)>
        ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>,_void_(uWS::WebSocket<true,_true>_*)>
                      *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        iVar2 = us_socket_is_closed(1,in_stack_00000008);
        if ((iVar2 != 0) || ((*(byte *)(local_40 + 0x5c) & 1) != 0)) {
          return true;
        }
      }
    }
    else if ((local_20 == 10) &&
            (bVar1 = fu2::abi_400::detail::function::operator_cast_to_bool
                               ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
                                 *)0x272ed1), bVar1)) {
      fu2::abi_400::detail::type_erasure::invocation_table::
      operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>,_void_(uWS::WebSocket<true,_true>_*)>
      ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>,_void_(uWS::WebSocket<true,_true>_*)>
                    *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      iVar2 = us_socket_is_closed(1,in_stack_00000008);
      if ((iVar2 != 0) || ((*(byte *)(local_40 + 0x5c) & 1) != 0)) {
        return true;
      }
    }
  }
  else {
    std::__cxx11::string::append((char *)(local_40 + 0x38),(ulong)local_10);
    iVar2 = (int)in_stack_fffffffffffffea0;
    *(int *)(local_40 + 0x58) = (int)local_18 + *(int *)(local_40 + 0x58);
    if ((local_1c == 0) && ((local_21 & 1) != 0)) {
      lVar4 = std::__cxx11::string::data();
      lVar6 = std::__cxx11::string::length();
      if (local_20 == 8) {
        protocol::parseClosePayload
                  (in_stack_fffffffffffffe50,
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffeb0,
                   local_138,local_130);
        message_00._M_str = in_stack_ffffffffffffff20;
        message_00._M_len = (size_t)pWVar9;
        WebSocket<true,_true>::end(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,message_00);
        return true;
      }
      if (local_20 == 9) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffea0,
                   (char *)((lVar4 + lVar6) - (long)*(int *)(local_40 + 0x58)),
                   (long)*(int *)(local_40 + 0x58));
        WebSocket<true,_true>::send(pWVar9,iVar2,in_stack_fffffffffffffea8,10,0);
        bVar1 = fu2::abi_400::detail::function::operator_cast_to_bool
                          ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
                            *)0x2730d4);
        if (bVar1) {
          fu2::abi_400::detail::type_erasure::invocation_table::
          operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>,_void_(uWS::WebSocket<true,_true>_*)>
          ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>,_void_(uWS::WebSocket<true,_true>_*)>
                        *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          iVar2 = us_socket_is_closed(1,in_stack_00000008);
          if ((iVar2 != 0) || ((*(byte *)(local_40 + 0x5c) & 1) != 0)) {
            return true;
          }
        }
      }
      else if ((local_20 == 10) &&
              (bVar1 = fu2::abi_400::detail::function::operator_cast_to_bool
                                 ((function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>
                                   *)0x273147), bVar1)) {
        fu2::abi_400::detail::type_erasure::invocation_table::
        operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>,_void_(uWS::WebSocket<true,_true>_*)>
        ::operator()((operator_impl<0UL,_fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_void_(uWS::WebSocket<true,_true>_*)>_>,_void_(uWS::WebSocket<true,_true>_*)>
                      *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        iVar2 = us_socket_is_closed(1,in_stack_00000008);
        if ((iVar2 != 0) || ((*(byte *)(local_40 + 0x5c) & 1) != 0)) {
          return true;
        }
      }
      uVar7 = local_40 + 0x38;
      std::__cxx11::string::length();
      std::__cxx11::string::resize(uVar7);
      *(undefined4 *)(local_40 + 0x58) = 0;
    }
  }
  return false;
}

Assistant:

static bool handleFragment(char *data, size_t length, unsigned int remainingBytes, int opCode, bool fin, uWS::WebSocketState<isServer> *webSocketState, void *s) {
        /* WebSocketData and WebSocketContextData */
        WebSocketContextData<SSL> *webSocketContextData = (WebSocketContextData<SSL> *) us_socket_context_ext(SSL, us_socket_context(SSL, (us_socket_t *) s));
        WebSocketData *webSocketData = (WebSocketData *) us_socket_ext(SSL, (us_socket_t *) s);

        /* Is this a non-control frame? */
        if (opCode < 3) {
            /* Did we get everything in one go? */
            if (!remainingBytes && fin && !webSocketData->fragmentBuffer.length()) {

                /* Handle compressed frame */
                if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::COMPRESSED_FRAME) {
                        webSocketData->compressionStatus = WebSocketData::CompressionStatus::ENABLED;

                        LoopData *loopData = (LoopData *) us_loop_ext(us_socket_context_loop(SSL, us_socket_context(SSL, (us_socket_t *) s)));
                        auto [inflatedFrame, valid] = loopData->inflationStream->inflate(loopData->zlibContext, {data, length}, webSocketContextData->maxPayloadLength);
                        if (!valid) {
                            forceClose(webSocketState, s);
                            return true;
                        } else {
                            data = (char *) inflatedFrame.data();
                            length = inflatedFrame.length();
                        }
                }

                /* Check text messages for Utf-8 validity */
                if (opCode == 1 && !protocol::isValidUtf8((unsigned char *) data, length)) {
                    forceClose(webSocketState, s);
                    return true;
                }

                /* Emit message event & break if we are closed or shut down when returning */
                if (webSocketContextData->messageHandler) {
                    webSocketContextData->messageHandler((WebSocket<SSL, isServer> *) s, std::string_view(data, length), (uWS::OpCode) opCode);
                    if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                        return true;
                    }
                }
            } else {
                /* Allocate fragment buffer up front first time */
                if (!webSocketData->fragmentBuffer.length()) {
                    webSocketData->fragmentBuffer.reserve(length + remainingBytes);
                }
                /* Fragments forming a big message are not caught until appending them */
                if (refusePayloadLength(length + webSocketData->fragmentBuffer.length(), webSocketState, s)) {
                    forceClose(webSocketState, s);
                    return true;
                }
                webSocketData->fragmentBuffer.append(data, length);

                /* Are we done now? */
                // todo: what if we don't have any remaining bytes yet we are not fin? forceclose!
                if (!remainingBytes && fin) {

                    /* Handle compression */
                    if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::COMPRESSED_FRAME) {
                            webSocketData->compressionStatus = WebSocketData::CompressionStatus::ENABLED;

                            // what's really the story here?
                            webSocketData->fragmentBuffer.append("....");

                            LoopData *loopData = (LoopData *) us_loop_ext(
                                us_socket_context_loop(SSL,
                                    us_socket_context(SSL, (us_socket_t *) s)
                                )
                            );

                            auto [inflatedFrame, valid] = loopData->inflationStream->inflate(loopData->zlibContext, {webSocketData->fragmentBuffer.data(), webSocketData->fragmentBuffer.length() - 4}, webSocketContextData->maxPayloadLength);
                            if (!valid) {
                                forceClose(webSocketState, s);
                                return true;
                            } else {
                                data = (char *) inflatedFrame.data();
                                length = inflatedFrame.length();
                            }


                    } else {
                        // reset length and data ptrs
                        length = webSocketData->fragmentBuffer.length();
                        data = webSocketData->fragmentBuffer.data();
                    }

                    /* Check text messages for Utf-8 validity */
                    if (opCode == 1 && !protocol::isValidUtf8((unsigned char *) data, length)) {
                        forceClose(webSocketState, s);
                        return true;
                    }

                    /* Emit message and check for shutdown or close */
                    if (webSocketContextData->messageHandler) {
                        webSocketContextData->messageHandler((WebSocket<SSL, isServer> *) s, std::string_view(data, length), (uWS::OpCode) opCode);
                        if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                            return true;
                        }
                    }

                    /* If we shutdown or closed, this will be taken care of elsewhere */
                    webSocketData->fragmentBuffer.clear();
                }
            }
        } else {
            /* Control frames need the websocket to send pings, pongs and close */
            WebSocket<SSL, isServer> *webSocket = (WebSocket<SSL, isServer> *) s;

            if (!remainingBytes && fin && !webSocketData->controlTipLength) {
                if (opCode == CLOSE) {
                    auto closeFrame = protocol::parseClosePayload(data, length);
                    webSocket->end(closeFrame.code, std::string_view(closeFrame.message, closeFrame.length));
                    return true;
                } else {
                    if (opCode == PING) {
                        webSocket->send(std::string_view(data, length), (OpCode) OpCode::PONG);
                        if (webSocketContextData->pingHandler) {
                            webSocketContextData->pingHandler(webSocket);
                            if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                return true;
                            }
                        }
                    } else if (opCode == PONG) {
                        if (webSocketContextData->pongHandler) {
                            webSocketContextData->pongHandler(webSocket);
                            if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                return true;
                            }
                        }
                    }
                }
            } else {
                /* Here we never mind any size optimizations as we are in the worst possible path */
                webSocketData->fragmentBuffer.append(data, length);
                webSocketData->controlTipLength += (int) length;

                if (!remainingBytes && fin) {
                    char *controlBuffer = (char *) webSocketData->fragmentBuffer.data() + webSocketData->fragmentBuffer.length() - webSocketData->controlTipLength;
                    if (opCode == CLOSE) {
                        protocol::CloseFrame closeFrame = protocol::parseClosePayload(controlBuffer, webSocketData->controlTipLength);
                        webSocket->end(closeFrame.code, std::string_view(closeFrame.message, closeFrame.length));
                        return true;
                    } else {
                        if (opCode == PING) {
                            webSocket->send(std::string_view(controlBuffer, webSocketData->controlTipLength), (OpCode) OpCode::PONG);
                            if (webSocketContextData->pingHandler) {
                                webSocketContextData->pingHandler(webSocket);
                                if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                    return true;
                                }
                            }
                        } else if (opCode == PONG) {
                            if (webSocketContextData->pongHandler) {
                                webSocketContextData->pongHandler(webSocket);
                                if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                    return true;
                                }
                            }
                        }
                    }

                    /* Same here, we do not care for any particular smart allocation scheme */
                    webSocketData->fragmentBuffer.resize(webSocketData->fragmentBuffer.length() - webSocketData->controlTipLength);
                    webSocketData->controlTipLength = 0;
                }
            }
        }
        return false;
    }